

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O1

bool Rml::CombineAndDecompose(Transform *t,Element *e)

{
  pointer pTVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  long lVar10;
  float *pfVar11;
  anon_union_68_22_fc3e640e_for_TransformPrimitive_2 *paVar12;
  TransformPrimitive *primitive;
  pointer p;
  byte bVar13;
  DecomposedMatrix4 decomposed;
  MatrixAType local_108;
  TransformPrimitive local_c0;
  undefined1 local_78 [40];
  undefined8 uStack_50;
  undefined1 local_48 [16];
  float local_38;
  
  bVar13 = 0;
  if (Matrix4<float,Rml::ColumnMajorStorage<float>>::Identity()::identity == '\0') {
    CombineAndDecompose();
  }
  local_108.vectors[3].x =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].x;
  local_108.vectors[3].y =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].y;
  local_108.vectors[3].z =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].z;
  local_108.vectors[3].w =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[3].w;
  local_108.vectors[2].x =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].x;
  local_108.vectors[2].y =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].y;
  local_108.vectors[2].z =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].z;
  local_108.vectors[2].w =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[2].w;
  local_108.vectors[1].x =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].x;
  local_108.vectors[1].y =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].y;
  local_108.vectors[1].z =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].z;
  local_108.vectors[1].w =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[1].w;
  local_108.vectors[0].x =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].x;
  local_108.vectors[0].y =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].y;
  local_108.vectors[0].z =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].z;
  local_108.vectors[0].w =
       Matrix4<float,_Rml::ColumnMajorStorage<float>_>::Identity::identity.vectors[0].w;
  p = (t->primitives).
      super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>._M_impl.
      super__Vector_impl_data._M_start;
  pTVar1 = (t->primitives).
           super__Vector_base<Rml::TransformPrimitive,_std::allocator<Rml::TransformPrimitive>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (p != pTVar1) {
    uVar2 = local_108.vectors[0]._8_8_;
    uVar3 = local_108.vectors[1]._0_8_;
    uVar4 = local_108.vectors[1]._8_8_;
    uVar5 = local_108.vectors[2]._0_8_;
    uVar6 = local_108.vectors[2]._8_8_;
    uVar7 = local_108.vectors[3]._0_8_;
    uVar8 = local_108.vectors[3]._8_8_;
    do {
      local_108.vectors[3]._8_8_ = uVar8;
      local_108.vectors[3]._0_8_ = uVar7;
      local_108.vectors[2]._8_8_ = uVar6;
      local_108.vectors[2]._0_8_ = uVar5;
      local_108.vectors[1]._8_8_ = uVar4;
      local_108.vectors[1]._0_8_ = uVar3;
      local_108.vectors[0]._8_8_ = uVar2;
      TransformUtilities::ResolveTransform((Matrix4f *)local_78,p,e);
      Matrix4<float,_Rml::ColumnMajorStorage<float>_>::
      MatrixMultiplier<float,_Rml::ColumnMajorStorage<float>,_Rml::ColumnMajorStorage<float>_>::
      Multiply(&local_108,(Matrix4f *)local_78);
      local_108.vectors[0].y =
           local_c0.field_1.matrix_2d.super_ResolvedPrimitive<6UL>.values._M_elems[0];
      local_108.vectors[0].x = (float)local_c0.type;
      uVar2._0_4_ = (float)local_c0.field_1.translate_x.super_UnresolvedPrimitive<1UL>.values.
                           _M_elems[0].unit;
      uVar2._4_4_ = local_c0.field_1.matrix_2d.super_ResolvedPrimitive<6UL>.values._M_elems[2];
      uVar3._0_4_ = (float)local_c0.field_1.translate_2d.super_UnresolvedPrimitive<2UL>.values.
                           _M_elems[1].unit;
      uVar3._4_4_ = local_c0.field_1.matrix_2d.super_ResolvedPrimitive<6UL>.values._M_elems[4];
      uVar4._0_4_ = (float)local_c0.field_1.translate_3d.super_UnresolvedPrimitive<3UL>.values.
                           _M_elems[2].unit;
      uVar4._4_4_ = local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[6];
      uVar5._0_4_ = local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[7];
      uVar5._4_4_ = local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[8];
      uVar6._0_4_ = local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[9];
      uVar6._4_4_ = local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[10];
      uVar7._0_4_ = local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[0xb];
      uVar7._4_4_ = local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[0xc];
      uVar8._0_4_ = local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[0xd];
      uVar8._4_4_ = local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[0xe];
      local_108.vectors[3].x =
           local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[0xb];
      local_108.vectors[3].y =
           local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[0xc];
      local_108.vectors[3].z =
           local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[0xd];
      local_108.vectors[3].w =
           local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[0xe];
      local_108.vectors[2].x =
           local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[7];
      local_108.vectors[2].y =
           local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[8];
      local_108.vectors[2].z =
           local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[9];
      local_108.vectors[2].w =
           local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[10];
      local_108.vectors[1].x =
           (float)local_c0.field_1.translate_2d.super_UnresolvedPrimitive<2UL>.values._M_elems[1].
                  unit;
      local_108.vectors[1].y =
           local_c0.field_1.matrix_2d.super_ResolvedPrimitive<6UL>.values._M_elems[4];
      local_108.vectors[1].z =
           (float)local_c0.field_1.translate_3d.super_UnresolvedPrimitive<3UL>.values._M_elems[2].
                  unit;
      local_108.vectors[1].w =
           local_c0.field_1.matrix_3d.super_ResolvedPrimitive<16UL>.values._M_elems[6];
      local_108.vectors[0].z =
           (float)local_c0.field_1.translate_x.super_UnresolvedPrimitive<1UL>.values._M_elems[0].
                  unit;
      local_108.vectors[0].w =
           local_c0.field_1.matrix_2d.super_ResolvedPrimitive<6UL>.values._M_elems[2];
      p = p + 1;
    } while (p != pTVar1);
  }
  local_48._0_4_ = 0.0;
  local_48._4_4_ = 0.0;
  local_48._8_4_ = 0.0;
  local_48._12_4_ = 0.0;
  local_78._32_4_ = 0.0;
  local_78._36_4_ = 0.0;
  uStack_50._0_4_ = 0.0;
  uStack_50._4_4_ = 0.0;
  local_78._16_4_ = 0.0;
  local_78._20_4_ = 0.0;
  local_78._24_4_ = 0.0;
  local_78._28_4_ = 0.0;
  local_78._0_4_ = 0.0;
  local_78._4_4_ = 0.0;
  local_78._8_4_ = 0.0;
  local_78._12_4_ = 0.0;
  local_38 = 0.0;
  bVar9 = TransformUtilities::Decompose((DecomposedMatrix4 *)local_78,&local_108);
  if (bVar9) {
    Transform::ClearPrimitives(t);
    local_c0.type = DECOMPOSEDMATRIX4;
    pfVar11 = (float *)local_78;
    paVar12 = &local_c0.field_1;
    for (lVar10 = 0x11; lVar10 != 0; lVar10 = lVar10 + -1) {
      (paVar12->matrix_2d).super_ResolvedPrimitive<6UL>.values._M_elems[0] = *pfVar11;
      pfVar11 = pfVar11 + (ulong)bVar13 * -2 + 1;
      paVar12 = (anon_union_68_22_fc3e640e_for_TransformPrimitive_2 *)
                (&paVar12->scale_x + (ulong)bVar13 * -2 + 1);
    }
    Transform::AddPrimitive(t,&local_c0);
  }
  return bVar9;
}

Assistant:

static bool CombineAndDecompose(Transform& t, Element& e)
{
	Matrix4f m = Matrix4f::Identity();

	for (TransformPrimitive& primitive : t.GetPrimitives())
	{
		Matrix4f m_primitive = TransformUtilities::ResolveTransform(primitive, e);
		m *= m_primitive;
	}

	Transforms::DecomposedMatrix4 decomposed;

	if (!TransformUtilities::Decompose(decomposed, m))
		return false;

	t.ClearPrimitives();
	t.AddPrimitive(decomposed);

	return true;
}